

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O3

void __thiscall
webrtc::CompositionConverter::Convert
          (CompositionConverter *this,float **src,size_t src_size,float **dst,size_t dst_capacity)

{
  __uniq_ptr_impl<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> _Var1;
  __uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
  _Var2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  AudioConverter *pAVar6;
  ChannelBuffer<float> *pCVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  float **ppfVar8;
  pointer puVar9;
  float **ppfVar10;
  pointer puVar11;
  ulong uVar12;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_webrtc::AudioConverter_*,_std::default_delete<webrtc::AudioConverter>_>.
  super__Head_base<0UL,_webrtc::AudioConverter_*,_false>._M_head_impl =
       (((this->converters_).
         super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>.
       _M_t;
  ppfVar8 = ChannelBuffer<float>::channels
                      ((ChannelBuffer<float> *)
                       (((this->buffers_).
                         super__Vector_base<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                       ._M_t,0);
  _Var2._M_t.
  super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
  .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl =
       (((this->buffers_).
         super__Vector_base<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_webrtc::AudioConverter_*,_std::default_delete<webrtc::AudioConverter>_>
                        .super__Head_base<0UL,_webrtc::AudioConverter_*,_false>._M_head_impl + 0x10)
  )(_Var1._M_t.
    super__Tuple_impl<0UL,_webrtc::AudioConverter_*,_std::default_delete<webrtc::AudioConverter>_>.
    super__Head_base<0UL,_webrtc::AudioConverter_*,_false>._M_head_impl,src,src_size,ppfVar8,
    *(long *)((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                    .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl +
             0x28) *
    *(long *)((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                    .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl +
             0x18));
  puVar9 = (this->converters_).
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (this->converters_).
            super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0x10 < (ulong)((long)puVar11 - (long)puVar9)) {
    uVar12 = 2;
    do {
      puVar3 = (this->buffers_).
               super__Vector_base<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var1._M_t.
      super__Tuple_impl<0UL,_webrtc::AudioConverter_*,_std::default_delete<webrtc::AudioConverter>_>
      .super__Head_base<0UL,_webrtc::AudioConverter_*,_false>._M_head_impl =
           puVar9[uVar12]._M_t.
           super___uniq_ptr_impl<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>
           ._M_t;
      ppfVar8 = ChannelBuffer<float>::channels
                          ((ChannelBuffer<float> *)
                           puVar3[uVar12 - 2]._M_t.
                           super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                           ._M_t,0);
      _Var2._M_t.
      super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
      .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl =
           puVar3[uVar12 - 2]._M_t.
           super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           ._M_t;
      lVar4 = *(long *)((long)_Var2._M_t.
                              super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                              .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>.
                              _M_head_impl + 0x28);
      lVar5 = *(long *)((long)_Var2._M_t.
                              super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                              .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>.
                              _M_head_impl + 0x18);
      ppfVar10 = ChannelBuffer<float>::channels
                           ((ChannelBuffer<float> *)
                            puVar3[uVar12 - 1]._M_t.
                            super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                            ._M_t,0);
      _Var2._M_t.
      super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
      .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl =
           puVar3[uVar12 - 1]._M_t.
           super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           ._M_t;
      (**(code **)(*(long *)_Var1._M_t.
                            super__Tuple_impl<0UL,_webrtc::AudioConverter_*,_std::default_delete<webrtc::AudioConverter>_>
                            .super__Head_base<0UL,_webrtc::AudioConverter_*,_false>._M_head_impl +
                  0x10))(_Var1._M_t.
                         super__Tuple_impl<0UL,_webrtc::AudioConverter_*,_std::default_delete<webrtc::AudioConverter>_>
                         .super__Head_base<0UL,_webrtc::AudioConverter_*,_false>._M_head_impl,
                         ppfVar8,lVar4 * lVar5,ppfVar10,
                         *(long *)((long)_Var2._M_t.
                                         super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                                         .
                                         super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>
                                         ._M_head_impl + 0x28) *
                         *(long *)((long)_Var2._M_t.
                                         super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                                         .
                                         super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>
                                         ._M_head_impl + 0x18));
      uVar12 = uVar12 + 1;
      puVar9 = (this->converters_).
               super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar11 = (this->converters_).
                super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar12 < (ulong)((long)puVar11 - (long)puVar9 >> 3));
  }
  pAVar6 = puVar11[-1]._M_t.
           super___uniq_ptr_impl<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::AudioConverter_*,_std::default_delete<webrtc::AudioConverter>_>
           .super__Head_base<0UL,_webrtc::AudioConverter_*,_false>._M_head_impl;
  ppfVar8 = ChannelBuffer<float>::channels
                      ((this->buffers_).
                       super__Vector_base<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                       super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
                       .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl,0)
  ;
  pCVar7 = (this->buffers_).
           super__Vector_base<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>,_std::allocator<std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
           .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl;
  UNRECOVERED_JUMPTABLE = pAVar6->_vptr_AudioConverter[2];
  (*UNRECOVERED_JUMPTABLE)
            (pAVar6,ppfVar8,pCVar7->num_channels_ * pCVar7->num_frames_,dst,dst_capacity,
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void Convert(const float* const* src, size_t src_size, float* const* dst,
               size_t dst_capacity) override {
    converters_.front()->Convert(src, src_size, buffers_.front()->channels(),
                                 buffers_.front()->size());
    for (size_t i = 2; i < converters_.size(); ++i) {
      auto& src_buffer = buffers_[i - 2];
      auto& dst_buffer = buffers_[i - 1];
      converters_[i]->Convert(src_buffer->channels(),
                              src_buffer->size(),
                              dst_buffer->channels(),
                              dst_buffer->size());
    }
    converters_.back()->Convert(buffers_.back()->channels(),
                                buffers_.back()->size(), dst, dst_capacity);
  }